

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

int __thiscall cmValue::Compare(cmValue *this,string_view value)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  const_pointer pvVar1;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  cmValue *local_28;
  cmValue *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (cmValue *)value._M_len;
  local_28 = this;
  if ((this->Value == (string *)0x0) &&
     (pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local),
     pvVar1 == (const_pointer)0x0)) {
    return 0;
  }
  if (this->Value == (string *)0x0) {
    value_local._M_str._4_4_ = -1;
  }
  else {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (pvVar1 == (const_pointer)0x0) {
      value_local._M_str._4_4_ = 1;
    }
    else {
      local_38 = (basic_string_view<char,_std::char_traits<char>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)this->Value);
      __str._M_str = (char *)value_local._M_len;
      __str._M_len = (size_t)this_local;
      value_local._M_str._4_4_ =
           std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,__str);
    }
  }
  return value_local._M_str._4_4_;
}

Assistant:

int cmValue::Compare(cm::string_view value) const noexcept
{
  if (this->Value == nullptr && value.data() == nullptr) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (value.data() == nullptr) {
    return 1;
  }
  return cm::string_view(*this->Value).compare(value);
}